

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QDomNodePrivate * __thiscall
QDomDocumentTypePrivate::replaceChild
          (QDomDocumentTypePrivate *this,QDomNodePrivate *newChild,QDomNodePrivate *oldChild)

{
  QDomNodePrivate *pQVar1;
  int iVar2;
  QDomNamedNodeMapPrivate *pQVar3;
  long in_FS_OFFSET;
  QDomNodePrivate *p;
  iterator local_50;
  QArrayDataPointer<char16_t> local_38;
  QDomNodePrivate *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = QDomNodePrivate::replaceChild(&this->super_QDomNodePrivate,newChild,oldChild);
  if (local_20 == (QDomNodePrivate *)0x0) goto LAB_00110443;
  if (oldChild != (QDomNodePrivate *)0x0) {
    iVar2 = (*oldChild->_vptr_QDomNodePrivate[0xb])(oldChild);
    if (iVar2 == 6) {
      pQVar3 = this->entities;
    }
    else {
      iVar2 = (*oldChild->_vptr_QDomNodePrivate[0xb])(oldChild);
      if (iVar2 != 0xc) goto LAB_001103ad;
      pQVar3 = this->notations;
    }
    local_38.d = (oldChild->name).d.d;
    local_38.ptr = (oldChild->name).d.ptr;
    local_38.size = (oldChild->name).d.size;
    if (local_38.d != (Data *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QMultiHash<QString,_QDomNodePrivate_*>::removeImpl<QString>(&pQVar3->map,(QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
LAB_001103ad:
  pQVar1 = local_20;
  iVar2 = (*local_20->_vptr_QDomNodePrivate[0xb])(local_20);
  if (iVar2 == 6) {
    pQVar3 = this->entities;
    local_38.d = (pQVar1->name).d.d;
    local_38.ptr = (pQVar1->name).d.ptr;
    local_38.size = (pQVar1->name).d.size;
  }
  else {
    iVar2 = (*pQVar1->_vptr_QDomNodePrivate[0xb])(pQVar1);
    if (iVar2 != 0xc) goto LAB_00110443;
    pQVar3 = this->notations;
    local_38.d = (local_20->name).d.d;
    local_38.ptr = (local_20->name).d.ptr;
    local_38.size = (local_20->name).d.size;
  }
  if (local_38.d != (Data *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QMultiHash<QString,QDomNodePrivate*>::emplace<QDomNodePrivate*const&>
            (&local_50,&pQVar3->map,(QString *)&local_38,&local_20);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
LAB_00110443:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

QDomNodePrivate* QDomDocumentTypePrivate::replaceChild(QDomNodePrivate* newChild, QDomNodePrivate* oldChild)
{
    // Call the original implementation
    QDomNodePrivate* p = QDomNodePrivate::replaceChild(newChild, oldChild);
    // Update the maps
    if (p) {
        if (oldChild && oldChild->isEntity())
            entities->map.remove(oldChild->nodeName());
        else if (oldChild && oldChild->isNotation())
            notations->map.remove(oldChild->nodeName());

        if (p->isEntity())
            entities->map.insert(p->nodeName(), p);
        else if (p->isNotation())
            notations->map.insert(p->nodeName(), p);
    }

    return p;
}